

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonBlobExpand(JsonParse *pParse,u32 N)

{
  uint uVar1;
  uint uVar2;
  u8 *puVar3;
  
  uVar2 = 100;
  if (pParse->nBlobAlloc != 0) {
    uVar2 = pParse->nBlobAlloc * 2;
  }
  uVar1 = N + 100;
  if (N <= uVar2) {
    uVar1 = uVar2;
  }
  puVar3 = (u8 *)sqlite3DbRealloc(pParse->db,pParse->aBlob,(ulong)uVar1);
  if (puVar3 == (u8 *)0x0) {
    pParse->oom = '\x01';
  }
  else {
    pParse->aBlob = puVar3;
    pParse->nBlobAlloc = uVar1;
  }
  return (uint)(puVar3 == (u8 *)0x0);
}

Assistant:

static int jsonBlobExpand(JsonParse *pParse, u32 N){
  u8 *aNew;
  u32 t;
  assert( N>pParse->nBlobAlloc );
  if( pParse->nBlobAlloc==0 ){
    t = 100;
  }else{
    t = pParse->nBlobAlloc*2;
  }
  if( t<N ) t = N+100;
  aNew = sqlite3DbRealloc(pParse->db, pParse->aBlob, t);
  if( aNew==0 ){ pParse->oom = 1; return 1; }
  pParse->aBlob = aNew;
  pParse->nBlobAlloc = t;
  return 0;
}